

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_left_delim_join.cpp
# Opt level: O0

SinkCombineResultType __thiscall
duckdb::PhysicalLeftDelimJoin::Combine
          (PhysicalLeftDelimJoin *this,ExecutionContext *context,OperatorSinkCombineInput *input)

{
  LeftDelimJoinLocalState *this_00;
  LeftDelimJoinGlobalState *input_00;
  type this_01;
  undefined8 in_RSI;
  long in_RDI;
  OperatorSinkCombineInput distinct_combine_input;
  LeftDelimJoinGlobalState *gstate;
  LeftDelimJoinLocalState *lstate;
  GlobalSinkState *in_stack_ffffffffffffffc0;
  
  this_00 = LocalSinkState::Cast<duckdb::LeftDelimJoinLocalState>
                      ((LocalSinkState *)in_stack_ffffffffffffffc0);
  input_00 = GlobalSinkState::Cast<duckdb::LeftDelimJoinGlobalState>(in_stack_ffffffffffffffc0);
  LeftDelimJoinGlobalState::Merge
            ((LeftDelimJoinGlobalState *)this_00,(ColumnDataCollection *)input_00);
  this_01 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
            ::operator*((unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                         *)in_stack_ffffffffffffffc0);
  unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>::operator*
            ((unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>
              *)this_01);
  (**(code **)(**(long **)(in_RDI + 0x88) + 0xd8))
            (*(long **)(in_RDI + 0x88),in_RSI,&stack0xffffffffffffffc0);
  return FINISHED;
}

Assistant:

SinkCombineResultType PhysicalLeftDelimJoin::Combine(ExecutionContext &context, OperatorSinkCombineInput &input) const {
	auto &lstate = input.local_state.Cast<LeftDelimJoinLocalState>();
	auto &gstate = input.global_state.Cast<LeftDelimJoinGlobalState>();
	gstate.Merge(lstate.lhs_data);

	OperatorSinkCombineInput distinct_combine_input {*distinct.sink_state, *lstate.distinct_state,
	                                                 input.interrupt_state};
	distinct.Combine(context, distinct_combine_input);

	return SinkCombineResultType::FINISHED;
}